

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

Edge * __thiscall S2Polygon::Shape::edge(Edge *__return_storage_ptr__,Shape *this,int e)

{
  int iVar1;
  S2Polygon *pSVar2;
  VType VVar3;
  int *piVar4;
  pointer puVar5;
  S2Point *pSVar6;
  S2Point *pSVar7;
  ulong uVar8;
  int local_34;
  S2LogMessage local_30;
  
  local_34 = e;
  if (e < *(int *)&(this->super_S2Shape).field_0xc) {
    pSVar2 = this->polygon_;
    piVar4 = this->cumulative_edges_;
    if (piVar4 == (int *)0x0) {
      puVar5 = (pSVar2->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = 0;
      while (iVar1 = *(int *)((long)puVar5[uVar8]._M_t.
                                    super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t
                             + 0xc), iVar1 <= local_34) {
        uVar8 = uVar8 + 1;
        local_34 = local_34 - iVar1;
      }
    }
    else {
      piVar4 = std::__upper_bound<int*,int,__gnu_cxx::__ops::_Val_less_iter>
                         (piVar4,piVar4 + (int)((ulong)((long)(pSVar2->loops_).
                                                                                                                            
                                                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pSVar2->loops_).
                                                                                                                
                                                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                          &local_34);
      uVar8 = (ulong)((long)piVar4 + (-4 - (long)this->cumulative_edges_)) >> 2;
      local_34 = local_34 - piVar4[-1];
      puVar5 = (pSVar2->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pSVar6 = S2Loop::oriented_vertex
                       ((S2Loop *)
                        puVar5[(int)uVar8]._M_t.
                        super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,local_34);
    pSVar7 = S2Loop::oriented_vertex
                       ((S2Loop *)
                        (pSVar2->loops_).
                        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar8]._M_t.
                        super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
                        local_34 + 1);
    VVar3 = pSVar6->c_[1];
    (__return_storage_ptr__->v0).c_[0] = pSVar6->c_[0];
    (__return_storage_ptr__->v0).c_[1] = VVar3;
    (__return_storage_ptr__->v0).c_[2] = pSVar6->c_[2];
    VVar3 = pSVar7->c_[1];
    (__return_storage_ptr__->v1).c_[0] = pSVar7->c_[0];
    (__return_storage_ptr__->v1).c_[1] = VVar3;
    (__return_storage_ptr__->v1).c_[2] = pSVar7->c_[2];
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x5cf,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_30.stream_,"Check failed: (e) < (num_edges()) ");
  abort();
}

Assistant:

S2Shape::Edge S2Polygon::Shape::edge(int e) const {
  S2_DCHECK_LT(e, num_edges());
  const S2Polygon* p = polygon();
  int i;
  if (cumulative_edges_) {
    // "upper_bound" finds the loop just beyond the one we want.
    int* start = std::upper_bound(cumulative_edges_,
                                  cumulative_edges_ + p->num_loops(), e) - 1;
    i = start - cumulative_edges_;
    e -= *start;
  } else {
    // When the number of loops is small, linear search is faster.  Most often
    // there is exactly one loop and the code below executes zero times.
    for (i = 0; e >= p->loop(i)->num_vertices(); ++i) {
      e -= p->loop(i)->num_vertices();
    }
  }
  return Edge(p->loop(i)->oriented_vertex(e),
              p->loop(i)->oriented_vertex(e + 1));
}